

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void total_changes(sqlite3_context *context,int NotUsed,sqlite3_value **NotUsed2)

{
  sqlite3_result_int64(context,context->pOut->db->nTotalChange);
  return;
}

Assistant:

SQLITE_API sqlite3 *sqlite3_context_db_handle(sqlite3_context *p){
#ifdef SQLITE_ENABLE_API_ARMOR
  if( p==0 ) return 0;
#else
  assert( p && p->pOut );
#endif
  return p->pOut->db;
}